

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

void __thiscall
RuntimeObjectSystem::CompileAllInProject
          (RuntimeObjectSystem *this,bool bForceRecompile,unsigned_short projectId_)

{
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  reference filePath_;
  string local_a8;
  undefined1 local_88 [8];
  FileToBuild fileToBuild;
  size_t i;
  undefined1 local_40 [8];
  AUDynArray<IObjectConstructor_*> constructors;
  ProjectSettings *project;
  unsigned_short projectId__local;
  bool bForceRecompile_local;
  RuntimeObjectSystem *this_local;
  
  constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)GetProject(this,projectId_);
  std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::clear
            (&((ProjectSettings *)
              constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
              super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->m_BuildFileList);
  if ((this->m_bAutoCompile & 1U) == 0) {
    AUDynArray<IObjectConstructor_*>::AUDynArray((AUDynArray<IObjectConstructor_*> *)local_40,0);
    (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[4])
              (this->m_pObjectFactorySystem,(AUDynArray<IObjectConstructor_*> *)local_40);
    SetupRuntimeFileTracking(this,(IAUDynArray<IObjectConstructor_*> *)local_40);
    AUDynArray<IObjectConstructor_*>::~AUDynArray((AUDynArray<IObjectConstructor_*> *)local_40);
  }
  fileToBuild.forceCompile = false;
  fileToBuild._41_7_ = 0;
  while( true ) {
    uVar1 = fileToBuild._40_8_;
    pvVar3 = std::
             vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
             ::operator[](&this->m_Projects,(ulong)projectId_);
    sVar4 = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::size
                      (&pvVar3->m_RuntimeFileList);
    if (sVar4 <= (ulong)uVar1) break;
    filePath_ = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::
                operator[]((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)
                           (constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
                            super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x1e),
                           fileToBuild._40_8_);
    BuildTool::FileToBuild::FileToBuild((FileToBuild *)local_88,filePath_,true);
    FileSystemUtils::Path::Extension_abi_cxx11_(&local_a8,(Path *)local_88);
    bVar2 = std::operator!=(&local_a8,".h");
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar2) {
      std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::push_back
                ((vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *)
                 (constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
                  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0x33),(value_type *)local_88);
    }
    BuildTool::FileToBuild::~FileToBuild((FileToBuild *)local_88);
    fileToBuild._40_8_ = fileToBuild._40_8_ + 1;
  }
  StartRecompile(this);
  return;
}

Assistant:

void RuntimeObjectSystem::CompileAllInProject( bool bForceRecompile, unsigned short projectId_ )
{
    (void)bForceRecompile;
    ProjectSettings& project = GetProject( projectId_ );
    // since this is a compile all we can clear any pending compiles
    project.m_BuildFileList.clear( );

	// ensure we have an up to date list of files to commpile if autocompile is off
	if( !m_bAutoCompile )
	{
		AUDynArray<IObjectConstructor*> constructors;
		m_pObjectFactorySystem->GetAll(constructors);
		SetupRuntimeFileTracking(constructors);
	}

	// add all files except headers
    for( size_t i = 0; i < m_Projects[ projectId_ ].m_RuntimeFileList.size( ); ++i )
	{
        BuildTool::FileToBuild fileToBuild( project.m_RuntimeFileList[ i ], true ); //force re-compile on compile all
		if( fileToBuild.filePath.Extension() != ".h") //TODO: change to check for .cpp and .c as could have .inc files etc.?
		{
            project.m_BuildFileList.push_back( fileToBuild );
		}
	}

	StartRecompile();
}